

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int magma_get_asn1_parameters(EVP_CIPHER_CTX *ctx,ASN1_TYPE *params)

{
  int iVar1;
  size_t ukm_offset;
  undefined8 *puVar2;
  uchar *in_RSI;
  size_t in_RDI;
  uchar iv [16];
  ossl_gost_cipher_ctx *c;
  undefined8 local_38;
  undefined8 local_30;
  uchar *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  ukm_offset = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  *(undefined4 *)(ukm_offset + 8) = 0x2000;
  iVar1 = gost2015_get_asn1_params
                    ((ASN1_TYPE *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     in_RDI,in_RSI,ukm_offset,in_stack_ffffffffffffffd8);
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  else {
    puVar2 = (undefined8 *)EVP_CIPHER_CTX_iv_noconst(in_RDI);
    *puVar2 = local_38;
    puVar2[1] = local_30;
    puVar2 = (undefined8 *)EVP_CIPHER_CTX_original_iv(in_RDI);
    *puVar2 = local_38;
    puVar2[1] = local_30;
    *(undefined4 *)(ukm_offset + 8) = 0x2000;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int magma_get_asn1_parameters(EVP_CIPHER_CTX *ctx, ASN1_TYPE *params)
{
  struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
	unsigned char iv[16];

	c->key_meshing = 8192;

	if (gost2015_get_asn1_params(params, MAGMA_UKM_LEN, iv, 4, c->kdf_seed) < 0)
	    return -1;

	memcpy(EVP_CIPHER_CTX_iv_noconst(ctx), iv, sizeof(iv));
	memcpy((unsigned char *)EVP_CIPHER_CTX_original_iv(ctx), iv, sizeof(iv));
	/* Key meshing 8 kb*/
	c->key_meshing = 8192;

	return 1;
}